

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

bool __thiscall S2Builder::Build(S2Builder *this,S2Error *error)

{
  S2LogMessage local_20;
  
  if (error != (S2Error *)0x0) {
    error->code_ = OK;
    (error->text_)._M_string_length = 0;
    *(error->text_)._M_dataplus._M_p = '\0';
    this->error_ = error;
    local_20.severity_ =
         (LogSeverity)
         ((ulong)((long)(this->input_edges_).
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->input_edges_).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->layer_begins_,(int *)&local_20)
    ;
    if ((this->snapping_requested_ == true) && ((this->options_).idempotent_ == false)) {
      this->snapping_needed_ = true;
    }
    ChooseSites(this);
    BuildLayers(this);
    Reset(this);
    return error->code_ == OK;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x1ce,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_20.stream_,"Check failed: error != nullptr ");
  abort();
}

Assistant:

bool S2Builder::Build(S2Error* error) {
  // S2_CHECK rather than S2_DCHECK because this is friendlier than crashing on the
  // "error->ok()" call below.  It would be easy to allow (error == nullptr)
  // by declaring a local "tmp_error", but it seems better to make clients
  // think about error handling.
  S2_CHECK(error != nullptr);
  error->Clear();
  error_ = error;

  // Mark the end of the last layer.
  layer_begins_.push_back(input_edges_.size());

  // See the algorithm overview at the top of this file.
  if (snapping_requested_ && !options_.idempotent()) {
    snapping_needed_ = true;
  }
  ChooseSites();
  BuildLayers();
  Reset();
  return error->ok();
}